

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LDSketch.cpp
# Opt level: O2

LDSketch_t * LDSketch_init(int w,int h,int l,int lgn,longlong thresh_abs,uint tbl_id)

{
  dyn_tbl_t **ppdVar1;
  dyn_tbl_t *pdVar2;
  uint uVar3;
  ulong uVar4;
  allocator local_65;
  int local_64;
  int local_60;
  uint local_5c;
  LDSketch_t *local_58;
  char *local_50 [4];
  
  local_5c = tbl_id;
  if ((lgn < 0x70) && ((lgn & 7U) == 0)) {
    std::__cxx11::string::string((string *)local_50,"LDSketch",&local_65);
    local_58 = (LDSketch_t *)safe_calloc(1,0x28,local_50[0]);
    std::__cxx11::string::~string((string *)local_50);
    uVar3 = h * w;
    local_64 = h;
    local_60 = w;
    std::__cxx11::string::string((string *)local_50,"tbl->tbl",&local_65);
    ppdVar1 = (dyn_tbl_t **)safe_calloc((long)(int)uVar3,8,local_50[0]);
    local_58->tbl = ppdVar1;
    std::__cxx11::string::~string((string *)local_50);
    for (uVar4 = 0; (~((int)uVar3 >> 0x1f) & uVar3) != uVar4; uVar4 = uVar4 + 1) {
      pdVar2 = dyn_tbl_init(l,lgn,thresh_abs);
      ppdVar1[uVar4] = pdVar2;
    }
    local_58->h = local_64;
    local_58->w = local_60;
    local_58->l = l;
    local_58->lgn = lgn;
    local_58->tbl_id = local_5c;
    local_58->thresh_abs = (double)thresh_abs;
    return local_58;
  }
  fwrite("ERR: n too large or n not multiple of 8\n",0x28,1,_stderr);
  exit(-1);
}

Assistant:

LDSketch_t* LDSketch_init(int w, int h, int l, int lgn, long long thresh_abs,
	unsigned int tbl_id) {
	LDSketch_t* LDSketch;

	// error checking
	if (lgn / 8 > 13 || lgn % 8 != 0) {  // maximum # of bits of a key = 104
		fprintf(stderr, "ERR: n too large or n not multiple of 8\n");
		exit(-1);
	}

	// safe calloc
	LDSketch = (LDSketch_t*)safe_calloc(1, sizeof(LDSketch_t),
		std::string("LDSketch").c_str());
	LDSketch->tbl = (dyn_tbl_t**)safe_calloc(h * w, sizeof(long long),
		std::string("tbl->tbl").c_str());
	for (int i = 0; i < h * w; ++i) {
		LDSketch->tbl[i] = dyn_tbl_init(l, lgn, thresh_abs);
	}

	// set parameters
	LDSketch->h = h;
	LDSketch->w = w;
	LDSketch->l = l;
	// LDSketch->size = h * w;
	LDSketch->lgn = lgn;
	LDSketch->tbl_id = tbl_id;
	LDSketch->thresh_abs = thresh_abs;
	// LDSketch->total = 0;

	// return
	return LDSketch;
}